

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_array_implicit
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  LayoutBindingProgram *this_00;
  mapped_type_conflict *pmVar6;
  ulong uVar7;
  bool passed;
  ulong uVar8;
  long lVar9;
  bool *pbVar10;
  uint *puVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  ulong local_4a0;
  LayoutBindingTestResult *local_498;
  string *local_490;
  uint *local_488;
  ulong local_480;
  String local_478;
  StringVector list;
  String local_430;
  vector<int,_std::allocator<int>_> bindings;
  string local_3f8 [32];
  String local_3d8;
  String decl;
  String local_398;
  String local_378;
  string local_358 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  StringIntMap bindingPoints;
  StringStream s;
  undefined4 extraout_var_01;
  
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar4,0);
  local_490 = (string *)&__return_storage_ptr__->m_reason;
  passed = true;
  local_498 = __return_storage_ptr__;
  do {
    if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish <=
        bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
      LayoutBindingTestResult::LayoutBindingTestResult(local_498,passed,(String *)&s,false);
      std::__cxx11::string::~string((string *)&s);
      break;
    }
    uVar12 = *bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    local_488 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
    iVar4 = iVar4 - uVar12;
    if (3 < iVar4) {
      iVar4 = 4;
    }
    local_4a0 = CONCAT44(local_4a0._4_4_,iVar4);
    local_480 = (ulong)uVar12;
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,*(char **)CONCAT44(extraout_var,iVar4),&local_4a1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
              (&bindingPoints,this,local_480);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,*(char **)(CONCAT44(extraout_var_00,iVar4) + 0x18),&local_4a2);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&list,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_478,this,&list);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_3f8,this,0);
    std::__cxx11::string::string<std::allocator<char>>(local_358,"float",&local_4a3);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_3d8,this,local_3f8,local_358);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_378,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
              (&local_398,this,local_4a0 & 0xffffffff);
    buildUniformDecl(&decl,this,(String *)&s,(String *)&bindingPoints,&local_430,&local_478,
                     &local_3d8,&local_378,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_3f8);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&list);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&bindingPoints);
    std::__cxx11::string::~string((string *)&s);
    setTemplateParam(this,"UNIFORM_DECL",&decl);
    StringStream::StringStream(&s);
    uVar12 = 0;
    uVar8 = 0;
    if (0 < (int)local_4a0) {
      uVar8 = local_4a0 & 0xffffffff;
    }
    for (; (uint)uVar8 != uVar12; uVar12 = uVar12 + 1) {
      pbVar10 = (bool *)0x182f9dd;
      if (uVar12 == 0) {
        pbVar10 = fixed_sample_locations_values + 1;
      }
      poVar5 = std::operator<<((ostream *)&s,pbVar10);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1f])
                (&local_430,this,0,(ulong)uVar12);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
                ((string *)&bindingPoints,this,&local_430);
      std::operator<<(poVar5,(string *)&bindingPoints);
      std::__cxx11::string::~string((string *)&bindingPoints);
      std::__cxx11::string::~string((string *)&local_430);
    }
    std::operator<<((ostream *)&s,";\n");
    std::__cxx11::stringbuf::str();
    setTemplateParam(this,"UNIFORM_ACCESS",(String *)&bindingPoints);
    std::__cxx11::string::~string((string *)&bindingPoints);
    updateTemplate(this);
    iVar4 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])();
    this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar4);
    bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
    bVar14 = passed != false;
    passed = bVar14 && bVar3;
    if (bVar14 && bVar3) {
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar12 = 0; (uint)uVar8 != uVar12; uVar12 = uVar12 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&bindingPoints);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_430,this,0);
        std::operator<<((ostream *)&bindingPoints,(string *)&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_478,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (&local_430,this,&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        if (local_430._M_string_length != 0) {
          std::operator<<((ostream *)&bindingPoints,"_block");
        }
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                  (&local_478,this,(ulong)uVar12);
        std::operator<<((ostream *)&bindingPoints,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                   &local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bindingPoints);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_338,&list);
      (*this_00->_vptr_LayoutBindingProgram[3])(&bindingPoints,this_00,&local_338);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_338);
      local_4a0 = (ulong)(int)local_4a0;
      uVar7 = local_480;
      lVar1 = 0;
      lVar2 = -0x20;
      do {
        lVar13 = lVar2;
        lVar9 = lVar1;
        if (-lVar9 == uVar8) goto LAB_00be5bb5;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&bindingPoints,
                              (key_type *)
                              ((long)&list.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                              + lVar13));
        iVar4 = (int)uVar7;
        if (passed == false) break;
        passed = true;
        uVar7 = (ulong)(iVar4 + 1);
        lVar1 = lVar9 + -1;
        lVar2 = lVar13 + 0x20;
      } while (iVar4 == *pmVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"binding point did not match default",
                 (allocator<char> *)&local_3d8);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&bindingPoints,
                            (key_type *)
                            ((long)&list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p +
                            lVar13));
      generateLog<int,int>(&local_430,this,&local_478,*pmVar6,iVar4);
      local_498->m_passed = false;
      local_498->m_notRunForThisContext = false;
      std::__cxx11::string::string(local_490,(string *)&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_478);
      passed = false;
LAB_00be5bb5:
      bVar3 = (long)local_4a0 <= -lVar9;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&bindingPoints._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
      puVar11 = local_488;
    }
    else {
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&bindingPoints,this_00,false);
      local_498->m_passed = false;
      local_498->m_notRunForThisContext = false;
      std::__cxx11::string::string(local_490,(string *)&bindingPoints);
      puVar11 = local_488;
      std::__cxx11::string::~string((string *)&bindingPoints);
      bVar3 = false;
      passed = false;
    }
    (*this_00->_vptr_LayoutBindingProgram[1])();
    StringStream::~StringStream(&s);
    std::__cxx11::string::~string((string *)&decl);
    bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(puVar11 + 1);
  } while (bVar3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bindings.super__Vector_base<int,_std::allocator<int>_>);
  return local_498;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_array_implicit(void)
{
	bool passed = true;

	std::vector<int> bindings = makeSparseRange(maxBindings(), 0);
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int baseBindingPoint = *it;
		int arraySize		 = std::min(maxBindings() - baseBindingPoint, 4);

		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(baseBindingPoint),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		for (int idx = 0; idx < arraySize; idx++)
		{
			s << (idx ? " + " : "") << buildAccess(buildArrayAccess(0, idx));
		}
		s << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}
		StringVector list;
		for (int idx = 0; idx < arraySize; idx++)
		{
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName();
			const String& u = buildBlockName(getDefaultUniformName());
			if (!u.empty())
				texUnitStr << "_block";
			texUnitStr << buildArray(idx);
			list.push_back(texUnitStr.str());
		}

		StringIntMap bindingPoints = program->getBindingPoints(list);
		for (int idx = 0; idx < arraySize; idx++)
		{
			passed &= ((baseBindingPoint + idx) == bindingPoints[list[idx]]);
			if (!passed)
			{
				return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
																   bindingPoints[list[idx]], (baseBindingPoint + idx)));
			}
		}
	}
	return LayoutBindingTestResult(passed, String());
}